

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

Float pbrt::
      NewtonBisection<pbrt::InvertCatmullRom(pstd::span<float_const>,pstd::span<float_const>,float)::__1>
                (Float x0,Float x1,anon_class_40_5_71e24d41 f,Float xEps,Float fEps)

{
  undefined8 uVar1;
  int iVar2;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  pair<float,_float> fxMid;
  Float xMid;
  bool startIsNegative;
  Float fx1;
  Float fx0;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  float local_2c;
  float local_20;
  float local_c;
  float local_8;
  float local_4;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar5._0_8_ = InvertCatmullRom::anon_class_40_5_71e24d41::operator()
                           ((anon_class_40_5_71e24d41 *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4);
  auVar5._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  local_20 = (float)uVar1;
  iVar2 = (int)&stack0x00000008;
  auVar6._0_8_ = InvertCatmullRom::anon_class_40_5_71e24d41::operator()
                           ((anon_class_40_5_71e24d41 *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4);
  auVar6._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  local_2c = (float)uVar1;
  fVar3 = local_20;
  std::abs(iVar2);
  local_4 = in_XMM0_Da;
  if ((in_XMM3_Da <= fVar3) &&
     (fVar3 = local_2c, std::abs(iVar2), local_4 = in_XMM1_Da, in_XMM3_Da <= fVar3)) {
    local_4 = in_XMM0_Da + ((in_XMM1_Da - in_XMM0_Da) * -local_20) / (local_2c - local_20);
    local_c = in_XMM1_Da;
    local_8 = in_XMM0_Da;
    while( true ) {
      if ((local_4 <= local_8) || (local_c <= local_4)) {
        local_4 = (local_8 + local_c) / 2.0;
      }
      iVar2 = (int)&stack0x00000008;
      auVar7._0_8_ = InvertCatmullRom::anon_class_40_5_71e24d41::operator()
                               ((anon_class_40_5_71e24d41 *)
                                CONCAT44(local_4,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4);
      auVar7._8_56_ = extraout_var_01;
      uVar1 = vmovlpd_avx(auVar7._0_16_);
      fVar4 = (float)uVar1;
      in_stack_ffffffffffffffc8 = (float)((ulong)uVar1 >> 0x20);
      fVar3 = local_4;
      if (local_20 < 0.0 == fVar4 < 0.0) {
        fVar3 = local_c;
        local_8 = local_4;
      }
      local_c = fVar3;
      if ((local_c - local_8 < in_XMM2_Da) ||
         (in_stack_ffffffffffffffc4 = fVar4, std::abs(iVar2), fVar4 < in_XMM3_Da)) break;
      local_4 = local_4 - in_stack_ffffffffffffffc4 / in_stack_ffffffffffffffc8;
    }
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU inline Float NewtonBisection(Float x0, Float x1, Func f, Float xEps = 1e-6f,
                                          Float fEps = 1e-6f) {
    // Check function endpoints for roots
    DCHECK_LT(x0, x1);
    Float fx0 = f(x0).first, fx1 = f(x1).first;
    if (std::abs(fx0) < fEps)
        return x0;
    if (std::abs(fx1) < fEps)
        return x1;
    bool startIsNegative = fx0 < 0;

    // Set initial midpoint using linear approximation of _f_
    Float xMid = x0 + (x1 - x0) * -fx0 / (fx1 - fx0);

    while (true) {
        // Fall back to bisection if _xMid_ is out of bounds
        if (!(x0 < xMid && xMid < x1))
            xMid = (x0 + x1) / 2;

        // Evaluate function and narrow bracket range _[x0, x1]_
        std::pair<Float, Float> fxMid = f(xMid);
        DCHECK(!IsNaN(fxMid.first));
        if (startIsNegative == (fxMid.first < 0))
            x0 = xMid;
        else
            x1 = xMid;

        // Stop the iteration if converged
        if ((x1 - x0) < xEps || std::abs(fxMid.first) < fEps)
            return xMid;

        // Perform a Newton step
        xMid -= fxMid.first / fxMid.second;
    }
}